

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

int fileOut_object_version_3(FILE *img,object *globs)

{
  object *globs_local;
  FILE *img_local;
  
  if (inSpaceOne == 0) {
    indirArray = (object **)spaceOne;
  }
  else {
    indirArray = (object **)spaceTwo;
  }
  indirtop = 0;
  info_impl("fileOut_object_version_3",0x1ae,"Writing out image version 3.");
  put_image_version(img,'\x03');
  objectWrite(img,globs);
  return indirtop;
}

Assistant:

int fileOut_object_version_3(FILE *img, struct object *globs)
{
    /* use the currently unused space for the indir pointers */
    if (inSpaceOne) {
        indirArray = (struct object * *) spaceTwo;
    } else {
        indirArray = (struct object * *) spaceOne;
    }
    indirtop = 0;

    info("Writing out image version 3.");

    /* write the header. */
    put_image_version(img, IMAGE_VERSION_3);

    /* write the main objects. */
    objectWrite(img, globs);

    return indirtop;
}